

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ArenaStringPtr::Set
          (ArenaStringPtr *this,string *default_value,string *value,Arena *arena)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  
  if ((string *)(this->tagged_ptr_).ptr_ != default_value) {
    this_00 = UnsafeMutablePointer_abi_cxx11_(this);
    std::__cxx11::string::operator=((string *)this_00,(string *)value);
    return;
  }
  if (arena == (Arena *)0x0) {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20)
    ;
    (pbVar4->_M_dataplus)._M_p = (pointer)&pbVar4->field_2;
    pcVar2 = (value->_M_dataplus)._M_p;
    paVar1 = &value->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 == paVar1) {
      uVar3 = *(undefined8 *)((long)&value->field_2 + 8);
      (pbVar4->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&pbVar4->field_2 + 8) = uVar3;
    }
    else {
      (pbVar4->_M_dataplus)._M_p = pcVar2;
      (pbVar4->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    pbVar4->_M_string_length = value->_M_string_length;
    (value->_M_dataplus)._M_p = (pointer)paVar1;
    value->_M_string_length = 0;
    (value->field_2)._M_local_buf[0] = '\0';
  }
  else {
    pbVar4 = Arena::Create<std::__cxx11::string,std::__cxx11::string>(arena,value);
  }
  (this->tagged_ptr_).ptr_ = pbVar4;
  return;
}

Assistant:

void ArenaStringPtr::Set(const std::string* default_value, std::string&& value,
                         ::google::protobuf::Arena* arena) {
  if (IsDefault(default_value)) {
    if (arena == nullptr) {
      tagged_ptr_.Set(new std::string(std::move(value)));
    } else {
      tagged_ptr_.Set(Arena::Create<std::string>(arena, std::move(value)));
    }
  } else if (IsDonatedString()) {
    std::string* current = tagged_ptr_.Get();
    auto* s = new (current) std::string(std::move(value));
    arena->OwnDestructor(s);
    tagged_ptr_.Set(s);
  } else /* !IsDonatedString() */ {
    *UnsafeMutablePointer() = std::move(value);
  }
}